

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

void __thiscall
TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>_>::Resize
          (TPZVec<TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>_> *this,int64_t newsize)

{
  ulong uVar1;
  TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *pTVar2;
  TPZReference *pTVar3;
  ostream *poVar4;
  int64_t *piVar5;
  undefined8 *puVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize: ",0x27);
    poVar4 = std::ostream::_M_insert<long>((long)&std::cerr);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    std::ostream::flush();
  }
  lVar8 = this->fNElements;
  if (lVar8 != newsize) {
    if (newsize == 0) {
      this->fNElements = 0;
      this->fNAlloc = 0;
      pTVar2 = this->fStore;
      if (pTVar2 != (TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *)0x0) {
        pTVar3 = pTVar2[-1].fRef;
        if (pTVar3 != (TPZReference *)0x0) {
          lVar8 = (long)pTVar3 * 8;
          do {
            TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>::~TPZAutoPointer
                      ((TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *)
                       ((long)&pTVar2[-1].fRef + lVar8));
            lVar8 = lVar8 + -8;
          } while (lVar8 != 0);
        }
        operator_delete__(pTVar2 + -1,(long)pTVar3 * 8 + 8);
      }
      this->fStore = (TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *)0x0;
    }
    else {
      uVar1 = newsize * 8;
      uVar7 = 0xffffffffffffffff;
      if (uVar1 < 0xfffffffffffffff8) {
        uVar7 = uVar1 + 8;
      }
      lVar9 = 0;
      piVar5 = (int64_t *)operator_new__(-(ulong)((ulong)newsize >> 0x3d != 0) | uVar7);
      *piVar5 = newsize;
      do {
        puVar6 = (undefined8 *)operator_new(0x10);
        *(undefined4 *)(puVar6 + 1) = 0;
        *puVar6 = 0;
        LOCK();
        *(undefined4 *)(puVar6 + 1) = 1;
        UNLOCK();
        *(undefined8 **)((long)piVar5 + lVar9 + 8) = puVar6;
        lVar9 = lVar9 + 8;
      } while (uVar1 - lVar9 != 0);
      if (newsize <= lVar8) {
        lVar8 = newsize;
      }
      if (0 < lVar8) {
        lVar9 = 0;
        do {
          TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>::operator=
                    ((TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *)
                     ((long)&((TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *)(piVar5 + 1))->
                             fRef + lVar9),
                     (TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *)
                     ((long)&this->fStore->fRef + lVar9));
          lVar9 = lVar9 + 8;
          lVar8 = lVar8 + -1;
        } while (lVar8 != 0);
      }
      pTVar2 = this->fStore;
      if (pTVar2 != (TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *)0x0) {
        pTVar3 = pTVar2[-1].fRef;
        if (pTVar3 != (TPZReference *)0x0) {
          lVar8 = (long)pTVar3 * 8;
          do {
            TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>::~TPZAutoPointer
                      ((TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *)
                       ((long)&pTVar2[-1].fRef + lVar8));
            lVar8 = lVar8 + -8;
          } while (lVar8 != 0);
        }
        operator_delete__(pTVar2 + -1,(long)pTVar3 * 8 + 8);
      }
      this->fStore = (TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> *)(piVar5 + 1);
      this->fNElements = newsize;
      this->fNAlloc = newsize;
    }
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    //	int64_t nlongsize = 2147483647;
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
	}
#ifdef WIN32
	// Parece que o limite no windows é
	int sz = sizeof(T);
	int64_t nlongsize = 1704792168;
	if((newsize+1) > (1./sz)*nlongsize) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		std::cout << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
        //		DebugStop();
        //		return;
	}
#endif
#endif
	
	if(newsize == fNElements) return;
	if (newsize == 0) {
		fNElements = 0;
        fNAlloc = 0;
		delete[] fStore;
		fStore = nullptr;
		return;
	}
	T *newstore = new T[newsize];
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	if(fStore) delete[] fStore;
	fStore = newstore;
	fNElements = newsize;
    fNAlloc = newsize;
}